

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_nl2br(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char *zString;
  int iVar1;
  undefined8 in_RAX;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  bool bVar5;
  int nLen;
  
  nLen = (int)((ulong)in_RAX >> 0x20);
  if (nArg < 1) {
    jx9_result_string(pCtx,"",0);
  }
  else {
    pcVar2 = jx9_value_to_string(*apArg,&nLen);
    if (nLen < 1) {
      jx9_result_null(pCtx);
    }
    else {
      bVar5 = true;
      if (nArg != 1) {
        iVar1 = jx9_value_to_bool(apArg[1]);
        bVar5 = iVar1 == 0;
      }
      pcVar4 = pcVar2 + nLen;
      while( true ) {
        for (lVar3 = 0;
            ((zString = pcVar2 + lVar3, zString < pcVar4 && (*zString != '\n')) &&
            (*zString != '\r')); lVar3 = lVar3 + 1) {
        }
        if (pcVar2 < zString) {
          jx9_result_string(pCtx,pcVar2,(int)lVar3);
        }
        if (pcVar4 <= zString) break;
        if (bVar5) {
          pcVar2 = "<br/>";
          iVar1 = 5;
        }
        else {
          pcVar2 = "<br>";
          iVar1 = 4;
        }
        jx9_result_string(pCtx,pcVar2,iVar1);
        iVar1 = 0;
        for (pcVar2 = zString; (pcVar2 < pcVar4 && ((*pcVar2 == '\r' || (*pcVar2 == '\n'))));
            pcVar2 = pcVar2 + 1) {
          iVar1 = iVar1 + 1;
        }
        if (zString < pcVar2) {
          jx9_result_string(pCtx,zString,iVar1);
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_nl2br(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn, *zCur, *zEnd;
	int is_xhtml = 0;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	if( nArg > 1 ){
		is_xhtml = jx9_value_to_bool(apArg[1]);
	}
	zEnd = &zIn[nLen];
	/* Perform the requested operation */
	for(;;){
		zCur = zIn;
		/* Delimit the string */
		while( zIn < zEnd && (zIn[0] != '\n'&& zIn[0] != '\r') ){
			zIn++;
		}
		if( zCur < zIn ){
			/* Output chunk verbatim */
			jx9_result_string(pCtx, zCur, (int)(zIn-zCur));
		}
		if( zIn >= zEnd ){
			/* No more input to process */
			break;
		}
		/* Output the HTML line break */
		if( is_xhtml ){
			jx9_result_string(pCtx, "<br>", (int)sizeof("<br>")-1);
		}else{
			jx9_result_string(pCtx, "<br/>", (int)sizeof("<br/>")-1);
		}
		zCur = zIn;
		/* Append trailing line */
		while( zIn < zEnd && (zIn[0] == '\n'  || zIn[0] == '\r') ){
			zIn++;
		}
		if( zCur < zIn ){
			/* Output chunk verbatim */
			jx9_result_string(pCtx, zCur, (int)(zIn-zCur));
		}
	}
	return JX9_OK;
}